

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCalibrationHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::ModelCalibrationHelper::updateModelInertialParametersToString
          (ModelCalibrationHelper *this,string *model_string,VectorDynSize *inertialParams,
          string *filetype,ModelExporterOptions *options)

{
  _Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false> _Var1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Model *pMVar6;
  char *pcVar7;
  bool bVar8;
  Model exportedModel;
  string local_1e0;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0;
  long *local_198 [2];
  long local_188 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  Model local_160 [304];
  
  pMVar6 = ModelLoader::model(&((this->m_pimpl)._M_t.
                                super___uniq_ptr_impl<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
                                .
                                super__Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false>
                               ._M_head_impl)->modelLoader);
  iDynTree::Model::Model(local_160,pMVar6);
  cVar3 = iDynTree::Model::updateInertialParameters((VectorDynSize *)local_160);
  if (cVar3 == '\0') {
    pcVar7 = "Error in iDynTree::Model::updateInertialParameters method.";
  }
  else {
    _Var1._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
         .
         super__Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false>
         ._M_head_impl;
    pcVar2 = (options->baseLink)._M_dataplus._M_p;
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c0,pcVar2,pcVar2 + (options->baseLink)._M_string_length);
    local_1a0 = options->exportFirstBaseLinkAdditionalFrameAsFakeURDFBase;
    local_198[0] = local_188;
    pcVar2 = (options->robotExportedName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,pcVar2,pcVar2 + (options->robotExportedName)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178,&options->xmlBlobs);
    iVar5 = ModelExporter::init(&(_Var1._M_head_impl)->modelExporter,(EVP_PKEY_CTX *)local_160);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    if (local_198[0] != local_188) {
      operator_delete(local_198[0],local_188[0] + 1);
    }
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    if ((char)iVar5 == '\0') {
      bVar4 = false;
    }
    else {
      _Var1._M_head_impl =
           (this->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
           .
           super__Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false>
           ._M_head_impl;
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      pcVar2 = (filetype->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar2,pcVar2 + filetype->_M_string_length);
      bVar4 = ModelExporter::exportModelToString
                        (&(_Var1._M_head_impl)->modelExporter,model_string,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
    }
    bVar8 = true;
    if (bVar4 != false) goto LAB_0012606a;
    pcVar7 = "Error in ModelExporter::exportModelToString method.";
  }
  iDynTree::reportError("ModelCalibrationHelper","updateModelInertialParametersToString",pcVar7);
  bVar8 = false;
LAB_0012606a:
  iDynTree::Model::~Model(local_160);
  return bVar8;
}

Assistant:

bool ModelCalibrationHelper::updateModelInertialParametersToString(std::string & model_string, 
                                                                       const iDynTree::VectorDynSize& inertialParams,
                                                                       const std::string filetype,
                                                                       const ModelExporterOptions options)
    {
        Model exportedModel = this->model();
        
        bool ok = exportedModel.updateInertialParameters(inertialParams);
        if (!ok) {
            reportError("ModelCalibrationHelper", "updateModelInertialParametersToString", "Error in iDynTree::Model::updateInertialParameters method.");
            return false;
        }
        
        ok = m_pimpl->modelExporter.init(exportedModel, options);
        ok = ok && m_pimpl->modelExporter.exportModelToString(model_string, filetype);
        if (!ok) {
            reportError("ModelCalibrationHelper", "updateModelInertialParametersToString", "Error in ModelExporter::exportModelToString method.");
            return false;
        }

        return true;
    }